

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

void ecpTplJA3(word *b,word *a,ec_o *ec,void *stack)

{
  long lVar1;
  word *pwVar2;
  word *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  word *t7;
  word *t6;
  word *t5;
  word *t4;
  word *t3;
  word *t2;
  word *t1;
  size_t n;
  word *n_00;
  word *mod;
  word *b_00;
  word *a_00;
  word *c;
  word *a_01;
  
  lVar1 = *(long *)(*(long *)(in_RDX + 0x18) + 0x30);
  a_01 = in_RCX + lVar1;
  c = a_01 + lVar1;
  a_00 = c + lVar1;
  b_00 = a_00 + lVar1;
  mod = b_00 + lVar1;
  n_00 = mod + lVar1;
  pwVar2 = n_00 + lVar1;
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))
            (in_RCX,in_RSI + lVar1 * 8,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))
            (a_01,in_RSI + lVar1 * 0x10,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))(c,in_RCX,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  zzSubMod(c,a_00,b_00,mod,(size_t)n_00);
  zzAddMod(in_RCX,a_01,c,a_00,(size_t)b_00);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (a_00,a_00,b_00,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  zzAddMod(in_RCX,a_01,c,a_00,(size_t)b_00);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))(b_00,a_00,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (mod,in_RSI,in_RCX,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  zzAddMod(in_RCX,a_01,c,a_00,(size_t)b_00);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  zzSubMod(c,a_00,b_00,mod,(size_t)n_00);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))(n_00,mod,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  zzAddMod(in_RCX,a_01,c,a_00,(size_t)b_00);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))
            (in_RDI + lVar1 * 0x10,in_RDI + lVar1 * 0x10,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  zzSubMod(c,a_00,b_00,mod,(size_t)n_00);
  zzSubMod(c,a_00,b_00,mod,(size_t)n_00);
  zzAddMod(in_RCX,a_01,c,a_00,(size_t)b_00);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))(a_01,a_01,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  zzSubMod(c,a_00,b_00,mod,(size_t)n_00);
  zzSubMod(c,a_00,b_00,mod,(size_t)n_00);
  zzSubMod(c,a_00,b_00,mod,(size_t)n_00);
  zzSubMod(c,a_00,b_00,mod,(size_t)n_00);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))(c,a_01,c,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))(mod,mod,n_00,*(undefined8 *)(in_RDX + 0x18),pwVar2)
  ;
  zzSubMod(c,a_00,b_00,mod,(size_t)n_00);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (in_RDI + lVar1 * 8,in_RSI + lVar1 * 8,c,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (in_RCX,in_RCX,a_01,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (in_RDI,in_RSI,n_00,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  zzSubMod(c,a_00,b_00,mod,(size_t)n_00);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  zzDoubleMod(in_RCX,a_01,c,(size_t)a_00);
  return;
}

Assistant:

static void ecpTplJA3(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	word* t4 = t3 + n;
	word* t5 = t4 + n;
	word* t6 = t5 + n;
	word* t7 = t6 + n;
	stack = t7 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOn3(a, ec));
	ASSERT(wwIsSameOrDisjoint(a, b, 3 * n));
	// t1 <- ya^2 [YY]
	qrSqr(t1, ecY(a, n), ec->f, stack);
	// t2 <- za^2 [ZZ]
	qrSqr(t2, ecZ(a, n), ec->f, stack);
	// t3 <- t1^2 [YYYY]
	qrSqr(t3, t1, ec->f, stack);
	// t4 <- 3(xa - t2)(xa + t2) [M]
	zmSub(t4, ecX(a), t2, ec->f);
	zmAdd(t5, ecX(a), t2, ec->f);
	qrMul(t4, t4, t5, ec->f, stack);
	gfpDouble(t5, t4, ec->f);
	zmAdd(t4, t4, t5, ec->f);
	// t5 <- t4^2 [MM]
	qrSqr(t5, t4, ec->f, stack);
	// t6 <- 12 xa t1 - t5 [E]
	qrMul(t6, ecX(a), t1, ec->f, stack);
	gfpDouble(t7, t6, ec->f);
	zmAdd(t6, t6, t7, ec->f);
	gfpDouble(t6, t6, ec->f);
	gfpDouble(t6, t6, ec->f);
	zmSub(t6, t6, t5, ec->f);
	// t7 <- t6^2 [EE]
	qrSqr(t7, t6, ec->f, stack);
	// t3 <- 16 t3 [T]
	gfpDouble(t3, t3, ec->f);
	gfpDouble(t3, t3, ec->f);
	gfpDouble(t3, t3, ec->f);
	gfpDouble(t3, t3, ec->f);
	// zb <- (za + t6)^2 - t2 - t7
	zmAdd(ecZ(b, n), ecZ(a, n), t6, ec->f);
	qrSqr(ecZ(b, n), ecZ(b, n), ec->f, stack);
	zmSub(ecZ(b, n), ecZ(b, n), t2, ec->f);
	zmSub(ecZ(b, n), ecZ(b, n), t7, ec->f);
	// t2 <- (t4 + t6)^2 - t5 - t7 - t3 [U] 
	zmAdd(t2, t4, t6, ec->f);
	qrSqr(t2, t2, ec->f, stack);
	zmSub(t2, t2, t5, ec->f);
	zmSub(t2, t2, t7, ec->f);
	zmSub(t2, t2, t3, ec->f);
	// yb <- 8 ya (t2(t3 - t2) - t6 t7)
	zmSub(t3, t3, t2, ec->f);
	qrMul(t3, t2, t3, ec->f, stack);
	qrMul(t6, t6, t7, ec->f, stack);
	zmSub(t3, t3, t6, ec->f);
	qrMul(ecY(b, n), ecY(a, n), t3, ec->f, stack);
	gfpDouble(ecY(b, n), ecY(b, n), ec->f);
	gfpDouble(ecY(b, n), ecY(b, n), ec->f);
	gfpDouble(ecY(b, n), ecY(b, n), ec->f);
	// xb <- 4 (xa t7 - 4 t1 t2)
	qrMul(t1, t1, t2, ec->f, stack);
	gfpDouble(t1, t1, ec->f);
	gfpDouble(t1, t1, ec->f);
	qrMul(ecX(b), ecX(a), t7, ec->f, stack);
	zmSub(ecX(b), ecX(b), t1, ec->f);
	gfpDouble(ecX(b), ecX(b), ec->f);
	gfpDouble(ecX(b), ecX(b), ec->f);
}